

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O2

int match_udp(void *data,packet_t *pkt)

{
  byte bVar1;
  udp_t *puVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  if ((pkt->ip_proto == '\x11') && (puVar2 = pkt->udp, uVar4 = 0, puVar2 != (udp_t *)0x0)) {
    uVar3 = match_port(puVar2->src << 8 | puVar2->src >> 8,(uint16_t *)data);
    bVar1 = *(byte *)((long)data + 8);
    if (uVar3 != (bVar1 & 1)) {
      uVar4 = match_port(puVar2->dst << 8 | puVar2->dst >> 8,(uint16_t *)((long)data + 4));
      uVar4 = (uint)(uVar4 != ((bVar1 >> 1 & 1) != 0));
    }
  }
  return uVar4;
}

Assistant:

static int match_udp(void *data, packet_t *pkt)
{
	match_udp_t *m = (match_udp_t *)data;

	if (pkt->ip_proto != IPPROTO_UDP || pkt->udp == NULL) {
		return 0;
	}

	if (INVF(m, INV_UDP_SRC, !match_port(ntohs(pkt->udp->src), m->src))) {
		return 0;
	}

	if (INVF(m, INV_UDP_DST, !match_port(ntohs(pkt->udp->dst), m->dst))) {
		return 0;
	}

	return 1;
}